

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSimpleUpdater.cpp
# Opt level: O2

void __thiscall QSimpleUpdater::~QSimpleUpdater(QSimpleUpdater *this)

{
  QForeachContainer<QList<Updater_*>_> _container_34;
  QForeachContainer<QList<Updater_*>_> local_40;
  
  *(undefined ***)this = &PTR_metaObject_0011b2a0;
  QList<QString>::clear(&URLS);
  QtPrivate::QForeachContainer<QList<Updater_*>_>::QForeachContainer(&local_40,&UPDATERS);
  for (; local_40.i.i != local_40.e.i; local_40.i.i = local_40.i.i + 1) {
    QObject::deleteLater();
  }
  QArrayDataPointer<Updater_*>::~QArrayDataPointer((QArrayDataPointer<Updater_*> *)&local_40);
  QList<Updater_*>::clear(&UPDATERS);
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

QSimpleUpdater::~QSimpleUpdater()
{
   URLS.clear();

   foreach (Updater *updater, UPDATERS)
      updater->deleteLater();

   UPDATERS.clear();
}